

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O2

void google::anon_unknown_2::PushNameWithSuffix
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *suffixes,char *suffix)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  pcVar1 = ProgramInvocationShortName();
  StringPrintf_abi_cxx11_(&bStack_38,"/%s%s",pcVar1,suffix);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)suffixes,
             &bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

static void PushNameWithSuffix(vector<string>* suffixes, const char* suffix) {
  suffixes->push_back(
      StringPrintf("/%s%s", ProgramInvocationShortName(), suffix));
}